

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O3

void sGenXtrue(int n,int nrhs,float *x,int ldx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float *pfVar4;
  long lVar5;
  ulong uVar6;
  int iVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  long lVar10;
  
  auVar3 = _DAT_0011c570;
  auVar2 = _DAT_0011c560;
  auVar1 = _DAT_0011c4f0;
  if (0 < nrhs) {
    lVar5 = (ulong)(uint)n - 1;
    auVar7._8_4_ = (int)lVar5;
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
    pfVar4 = x + 3;
    uVar6 = 0;
    auVar7 = auVar7 ^ _DAT_0011c4f0;
    do {
      if (0 < n) {
        lVar5 = 0;
        auVar9 = auVar3;
        auVar11 = auVar2;
        do {
          auVar12 = auVar9 ^ auVar1;
          iVar8 = auVar7._4_4_;
          if ((bool)(~(auVar12._4_4_ == iVar8 && auVar7._0_4_ < auVar12._0_4_ ||
                      iVar8 < auVar12._4_4_) & 1)) {
            *(undefined4 *)((long)pfVar4 + lVar5 + -0xc) = 0x3f800000;
          }
          if ((auVar12._12_4_ != auVar7._12_4_ || auVar12._8_4_ <= auVar7._8_4_) &&
              auVar12._12_4_ <= auVar7._12_4_) {
            *(undefined4 *)((long)pfVar4 + lVar5 + -8) = 0x3f800000;
          }
          auVar12 = auVar11 ^ auVar1;
          iVar13 = auVar12._4_4_;
          if (iVar13 <= iVar8 && (iVar13 != iVar8 || auVar12._0_4_ <= auVar7._0_4_)) {
            *(undefined4 *)((long)pfVar4 + lVar5 + -4) = 0x3f800000;
            *(undefined4 *)((long)pfVar4 + lVar5) = 0x3f800000;
          }
          lVar10 = auVar9._8_8_;
          auVar9._0_8_ = auVar9._0_8_ + 4;
          auVar9._8_8_ = lVar10 + 4;
          lVar10 = auVar11._8_8_;
          auVar11._0_8_ = auVar11._0_8_ + 4;
          auVar11._8_8_ = lVar10 + 4;
          lVar5 = lVar5 + 0x10;
        } while ((ulong)(n + 3U >> 2) << 4 != lVar5);
      }
      uVar6 = uVar6 + 1;
      pfVar4 = pfVar4 + ldx;
    } while (uVar6 != (uint)nrhs);
  }
  return;
}

Assistant:

void
sGenXtrue(int n, int nrhs, float *x, int ldx)
{
    int  i, j;
    for (j = 0; j < nrhs; ++j)
	for (i = 0; i < n; ++i) {
	    x[i + j*ldx] = 1.0;/* + (float)(i+1.)/n;*/
	}
}